

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eLut.cpp
# Opt level: O0

int main(void)

{
  _Setw _Var1;
  ostream *poVar2;
  int i;
  unsigned_short eLut [512];
  int tableSize;
  int local_40c;
  unsigned_short local_408 [512];
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_8 = 0x200;
  initELut(local_408);
  std::operator<<((ostream *)&std::cout,
                  "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n");
  std::operator<<((ostream *)&std::cout,"{\n    ");
  for (local_40c = 0; local_40c < 0x200; local_40c = local_40c + 1) {
    _Var1 = std::setw(5);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_408[local_40c]);
    std::operator<<(poVar2,", ");
    if ((local_40c % 8 == 7) && (std::operator<<((ostream *)&std::cout,"\n"), local_40c < 0x1ff)) {
      std::operator<<((ostream *)&std::cout,"    ");
    }
  }
  std::operator<<((ostream *)&std::cout,"};\n");
  return 0;
}

Assistant:

int
main ()
{
    const int tableSize = 1 << 9;
    unsigned short eLut[tableSize];
    initELut (eLut);

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    cout << "{\n    ";

    for (int i = 0; i < tableSize; i++)
    {
	cout << setw (5) << eLut[i] << ", ";

	if (i % 8 == 7)
	{
	    cout << "\n";

	    if (i < tableSize - 1)
		cout << "    ";
	}
    }

    cout << "};\n";
    return 0;
}